

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::
emplace_back<helics::FederateState*>
          (StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>> *this,
          FederateState **args)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::blockCheck
            ((StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *)this);
  lVar2 = *(long *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 8);
  iVar1 = *(int *)(this + 0x18);
  *(int *)(this + 0x18) = iVar1 + 1;
  lVar3 = (long)iVar1 * 0x10;
  *(FederateState **)(lVar2 + lVar3) = *args;
  *(undefined1 *)(lVar2 + 8 + lVar3) = 0;
  *(long *)this = *(long *)this + 1;
  return;
}

Assistant:

void emplace_back(Args&&... args)
        {
            blockCheck();
            new (&(dataptr[dataSlotIndex][bsize++]))
                X(std::forward<Args>(args)...);
            ++csize;
        }